

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W3CPropagator.h
# Opt level: O1

void __thiscall
jaegertracing::propagation::
W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
::writeTraceParent(W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
                   *this,ostream *out,SpanContext *ctx)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  code cVar4;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(out,"00",2);
  uStack_28._0_6_ = CONCAT15(0x2d,(undefined5)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 5),1);
  writeTraceID(this,out,&ctx->_traceID);
  uStack_28._0_7_ = CONCAT16(0x2d,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 6),1);
  pp_Var2 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var2[-3]) = 0x10;
  p_Var3 = pp_Var2[-3];
  p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)p_Var3);
  if ((&out->field_0xe1)[(long)p_Var3] == '\0') {
    cVar4 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar4;
    p_Var1[0xe1] = (code)0x1;
  }
  p_Var1[0xe0] = (code)0x30;
  *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
       *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(0x2d,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 7),1);
  pp_Var2 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var2[-3]) = 2;
  p_Var3 = pp_Var2[-3];
  p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)p_Var3);
  if ((&out->field_0xe1)[(long)p_Var3] == '\0') {
    cVar4 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar4;
    p_Var1[0xe1] = (code)0x1;
  }
  p_Var1[0xe0] = (code)0x30;
  *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) =
       *(uint *)(&out->field_0x18 + (long)out->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  return;
}

Assistant:

void writeTraceParent(std::ostream& out, const SpanContext& ctx) const
    {
        out << "00";
        out << '-';
        writeTraceID(out, ctx.traceID());
        out << '-';
        out << std::setw(16) << std::setfill('0') << std::hex << ctx.spanID();
        out << '-';
        out << std::setw(2) << std::setfill('0') << std::hex
            << static_cast<size_t>(ctx.flags());
    }